

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 5_handler_from_function.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  JNIEnv jvm;
  JNIEnv local_14;
  
  *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) | 1;
  f(&local_14);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  bVar1 = (bool)std::ostream::flush();
  g(&local_14);
  poVar2 = std::ostream::_M_insert<bool>(bVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
   JNIEnv jvm;
   std::cout << std::boolalpha << f(&jvm) << std::endl << g(&jvm) << std::endl;
	return EXIT_SUCCESS;
}